

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

int bufcopy(uchar *a,int n,uchar *buffer,int *b,int bmax)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (n < 1) {
    return 0;
  }
  uVar5 = 0;
  uVar4 = bitbuffer;
  iVar3 = bits_to_go3;
  do {
    bVar1 = a[uVar5];
    if (bVar1 != 0) {
      uVar4 = uVar4 | code[bVar1] << ((byte)iVar3 & 0x1f);
      iVar3 = iVar3 + ncode[bVar1];
      bitbuffer = uVar4;
      bits_to_go3 = iVar3;
      if (7 < iVar3) {
        buffer[*b] = (uchar)uVar4;
        iVar2 = *b;
        *b = iVar2 + 1;
        if (bmax <= iVar2 + 1) {
          return 1;
        }
        uVar4 = (int)uVar4 >> 8;
        iVar3 = iVar3 + -8;
        bitbuffer = uVar4;
        bits_to_go3 = iVar3;
      }
    }
    uVar5 = uVar5 + 1;
  } while ((uint)n != uVar5);
  return 0;
}

Assistant:

static int
bufcopy(unsigned char a[], int n, unsigned char buffer[], int *b, int bmax)
{
int i;

	for (i = 0; i < n; i++) {
		if (a[i] != 0) {
			/*
			 * add Huffman code for a[i] to buffer
			 */
			bitbuffer |= code[a[i]] << bits_to_go3;
			bits_to_go3 += ncode[a[i]];
			if (bits_to_go3 >= 8) {
				buffer[*b] = bitbuffer & 0xFF;
				*b += 1;
				/*
				 * return warning code if we fill buffer
				 */
				if (*b >= bmax) return(1);
				bitbuffer >>= 8;
				bits_to_go3 -= 8;
			}
		}
	}
	return(0);
}